

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

AggregateFunction * duckdb::ApproxQuantileDecimalListFunction(LogicalType *type)

{
  AggregateFunction *in_RDI;
  AggregateFunction *function;
  LogicalType *in_stack_00000068;
  AggregateFunction *pAVar1;
  
  pAVar1 = in_RDI;
  GetApproxQuantileListAggregateFunction(in_stack_00000068);
  std::__cxx11::string::operator=((string *)&pAVar1->field_0x8,"approx_quantile");
  pAVar1->serialize = ApproximateQuantileBindData::Serialize;
  pAVar1->deserialize = ApproximateQuantileBindData::Deserialize;
  return in_RDI;
}

Assistant:

AggregateFunction ApproxQuantileDecimalListFunction(const LogicalType &type) {
	auto function = GetApproxQuantileListAggregateFunction(type);
	function.name = "approx_quantile";
	function.serialize = ApproximateQuantileBindData::Serialize;
	function.deserialize = ApproximateQuantileBindData::Deserialize;
	return function;
}